

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateNewBlock(Arena *this,size_t block_bytes)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  ulong in_RSI;
  long in_RDI;
  char *result;
  value_type *in_stack_ffffffffffffffb8;
  
  this_00 = (vector<char_*,_std::allocator<char_*>_> *)operator_new__(in_RSI);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(this_00,in_stack_ffffffffffffffb8);
  LOCK();
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + in_RSI + 8;
  UNLOCK();
  return (char *)this_00;
}

Assistant:

char* Arena::AllocateNewBlock(size_t block_bytes) {
  char* result = new char[block_bytes];
  blocks_.push_back(result);
  memory_usage_.fetch_add(block_bytes + sizeof(char*),
                          std::memory_order_relaxed);
  return result;
}